

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O2

qint64 __thiscall QAbstractFileEngine::readLine(QAbstractFileEngine *this,char *data,qint64 maxlen)

{
  int iVar1;
  int extraout_var;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  char c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (maxlen < 1) {
    maxlen = 0;
  }
  uVar2 = 0;
  do {
    uVar3 = maxlen;
    if (maxlen == uVar2) break;
    c = -0x56;
    iVar1 = (*this->_vptr_QAbstractFileEngine[0x23])(this,&c,1);
    if (CONCAT44(extraout_var,iVar1) == 0 || extraout_var < 0) {
      uVar3 = uVar2 | -(ulong)(uVar2 == 0);
      break;
    }
    data[uVar2] = c;
    uVar3 = uVar2 + 1;
    uVar2 = uVar3;
  } while (c != '\n');
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

qint64 QAbstractFileEngine::readLine(char *data, qint64 maxlen)
{
    qint64 readSoFar = 0;
    while (readSoFar < maxlen) {
        char c;
        qint64 readResult = read(&c, 1);
        if (readResult <= 0)
            return (readSoFar > 0) ? readSoFar : -1;
        ++readSoFar;
        *data++ = c;
        if (c == '\n')
            return readSoFar;
    }
    return readSoFar;
}